

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O0

void logmatch(logdir *ld)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint local_14;
  int i;
  logdir *ld_local;
  
  ld->match = '+';
  ld->matcherr = 'E';
  for (local_14 = 0; local_14 < (ld->inst).len; local_14 = uVar3 + local_14 + 1) {
    cVar1 = (ld->inst).s[(int)local_14];
    if ((cVar1 == '+') || (cVar1 == '-')) {
      iVar2 = pmatch((ld->inst).s + (int)(local_14 + 1),line,(uint)linelen);
      if (iVar2 != 0) {
        ld->match = (ld->inst).s[(int)local_14];
      }
    }
    else if (((cVar1 == 'E') || (cVar1 == 'e')) &&
            (iVar2 = pmatch((ld->inst).s + (int)(local_14 + 1),line,(uint)linelen), iVar2 != 0)) {
      ld->matcherr = (ld->inst).s[(int)local_14];
    }
    uVar3 = byte_chr((ld->inst).s + (int)local_14,(ld->inst).len - local_14,0);
  }
  return;
}

Assistant:

void logmatch(struct logdir *ld) {
  int i;

  ld->match ='+';
  ld->matcherr ='E';
  for (i =0; i < ld->inst.len; ++i) {
    switch(ld->inst.s[i]) {
    case '+':
    case '-':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->match =ld->inst.s[i];
      break;
    case 'e':
    case 'E':
      if (pmatch(&ld->inst.s[i +1], line, linelen))
        ld->matcherr =ld->inst.s[i];
      break;
    }
    i +=byte_chr(&ld->inst.s[i], ld->inst.len -i, 0);
  }
}